

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int run_suite(pcut_item_t *suite,pcut_item_t **last,char *prog_path)

{
  bool bVar1;
  pcut_item_t *local_38;
  pcut_item_t *it;
  int ret_code_tmp;
  int ret_code;
  int total_count;
  int is_first_test;
  char *prog_path_local;
  pcut_item_t **last_local;
  pcut_item_t *suite_local;
  
  bVar1 = true;
  ret_code_tmp = 0;
  it._4_4_ = 0;
  local_38 = pcut_get_real_next(suite);
  if ((local_38 != (pcut_item_t *)0x0) && (local_38->kind != 4)) {
    for (; (local_38 != (pcut_item_t *)0x0 && (local_38->kind != 4));
        local_38 = pcut_get_real_next(local_38)) {
      if (local_38->kind == 5) {
        if (bVar1) {
          pcut_report_suite_start(suite);
          bVar1 = false;
        }
        if (pcut_run_mode == 1) {
          it._0_4_ = pcut_run_test_forking(prog_path,local_38);
        }
        else {
          it._0_4_ = pcut_run_test_single(local_38);
        }
        if ((int)it != 0) {
          it._4_4_ = 1;
        }
        ret_code_tmp = ret_code_tmp + 1;
      }
    }
    if (0 < ret_code_tmp) {
      pcut_report_suite_done(suite);
    }
  }
  if (last != (pcut_item_t **)0x0) {
    *last = local_38;
  }
  return it._4_4_;
}

Assistant:

static int run_suite(pcut_item_t *suite, pcut_item_t **last, const char *prog_path) {
	int is_first_test = 1;
	int total_count = 0;
	int ret_code = PCUT_OUTCOME_PASS;
	int ret_code_tmp;

	pcut_item_t *it = pcut_get_real_next(suite);
	if ((it == NULL) || (it->kind == PCUT_KIND_TESTSUITE)) {
		goto leave_no_print;
	}

	for (; it != NULL; it = pcut_get_real_next(it)) {
		if (it->kind == PCUT_KIND_TESTSUITE) {
			goto leave_ok;
		}
		if (it->kind != PCUT_KIND_TEST) {
			continue;
		}

		if (is_first_test) {
			pcut_report_suite_start(suite);
			is_first_test = 0;
		}

		if (pcut_run_mode == PCUT_RUN_MODE_FORKING) {
			ret_code_tmp = pcut_run_test_forking(prog_path, it);
		} else {
			ret_code_tmp = pcut_run_test_single(it);
		}

		/*
		 * Override final return code in case of failure.
		 *
		 * In this case we suppress any special error codes as
		 * to the outside, there was a failure.
		 */
		if (ret_code_tmp != PCUT_OUTCOME_PASS) {
			ret_code = PCUT_OUTCOME_FAIL;
		}

		total_count++;
	}

leave_ok:
	if (total_count > 0) {
		pcut_report_suite_done(suite);
	}

leave_no_print:
	if (last != NULL) {
		*last = it;
	}

	return ret_code;
}